

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::startRequestSynchronously(QHttpThreadDelegate *this)

{
  undefined8 uVar1;
  QNetworkAccessCache **ppQVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this[0x88] = (QHttpThreadDelegate)0x1;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEventLoop::QEventLoop((QEventLoop *)&local_38,(QObject *)0x0);
  uVar1 = *(undefined8 *)(this + 0x158);
  *(undefined1 ***)(this + 0x158) = &local_38;
  QTimer::singleShot((nanoseconds)0x6fc23ac00,(QObject *)this,"1abortRequest()");
  QMetaObject::invokeMethod<>((QObject *)this,"startRequest",QueuedConnection);
  QEventLoop::exec(&local_38,0);
  ppQVar2 = QThreadStorage<QNetworkAccessCache_*>::localData(&connections);
  QNetworkAccessCache::releaseEntry((QNetworkAccessCache *)*ppQVar2,(QByteArray *)(this + 0x138));
  QThreadStorageData::set(&connections);
  *(undefined8 *)(this + 0x158) = uVar1;
  QEventLoop::~QEventLoop((QEventLoop *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::startRequestSynchronously()
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId();
#endif
    synchronous = true;

    QEventLoop synchronousRequestLoop;
    QScopedValueRollback<QEventLoop*> guard(this->synchronousRequestLoop, &synchronousRequestLoop);

    // Worst case timeout
    QTimer::singleShot(30*1000, this, SLOT(abortRequest()));

    QMetaObject::invokeMethod(this, "startRequest", Qt::QueuedConnection);
    synchronousRequestLoop.exec();

    connections.localData()->releaseEntry(cacheKey);
    connections.setLocalData(nullptr);

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::startRequestSynchronously() thread=" << QThread::currentThreadId() << "finished";
#endif
}